

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::SetProperty(cmTarget *this,string *prop,char *value)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  ostream *poVar4;
  cmTargetInternals *pcVar5;
  allocator local_8f9;
  value_type local_8f8;
  undefined1 local_8d8 [8];
  cmListFileBacktrace lfbt_5;
  ostringstream local_878 [8];
  ostringstream e_3;
  allocator local_6f9;
  value_type local_6f8;
  undefined1 local_6d8 [8];
  cmListFileBacktrace lfbt_4;
  ostringstream local_678 [8];
  ostringstream e_2;
  undefined1 local_500 [8];
  cmListFileBacktrace lfbt_3;
  value_type local_4b8;
  undefined1 local_498 [8];
  cmListFileBacktrace lfbt_2;
  value_type local_450;
  undefined1 local_430 [8];
  cmListFileBacktrace lfbt_1;
  value_type local_3e8;
  undefined1 local_3c8 [8];
  cmListFileBacktrace lfbt;
  value_type local_380;
  string local_360;
  ostringstream local_340 [8];
  ostringstream e_1;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream e;
  char *value_local;
  string *prop_local;
  cmTarget *this_local;
  
  TVar3 = GetType(this);
  if ((TVar3 != INTERFACE_LIBRARY) || (bVar2 = whiteListedInterfaceProperty(prop), bVar2)) {
    bVar2 = std::operator==(prop,"NAME");
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_340);
      std::operator<<((ostream *)local_340,"NAME property is read-only\n");
      pcVar1 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_360,false);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::ostringstream::~ostringstream(local_340);
    }
    else {
      bVar2 = std::operator==(prop,"INCLUDE_DIRECTORIES");
      if (bVar2) {
        pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&pcVar5->IncludeDirectoriesEntries);
        pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                  (&pcVar5->IncludeDirectoriesBacktraces);
        if (value != (char *)0x0) {
          pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_380,value,
                     (allocator *)((long)&lfbt.Snapshot.Position.Position + 7));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pcVar5->IncludeDirectoriesEntries,&local_380);
          std::__cxx11::string::~string((string *)&local_380);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&lfbt.Snapshot.Position.Position + 7));
          cmMakefile::GetBacktrace((cmListFileBacktrace *)local_3c8,this->Makefile);
          pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                    (&pcVar5->IncludeDirectoriesBacktraces,(value_type *)local_3c8);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_3c8);
        }
      }
      else {
        bVar2 = std::operator==(prop,"COMPILE_OPTIONS");
        if (bVar2) {
          pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&pcVar5->CompileOptionsEntries);
          pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                    (&pcVar5->CompileOptionsBacktraces);
          if (value != (char *)0x0) {
            pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_3e8,value,
                       (allocator *)((long)&lfbt_1.Snapshot.Position.Position + 7));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&pcVar5->CompileOptionsEntries,&local_3e8);
            std::__cxx11::string::~string((string *)&local_3e8);
            std::allocator<char>::~allocator
                      ((allocator<char> *)((long)&lfbt_1.Snapshot.Position.Position + 7));
            cmMakefile::GetBacktrace((cmListFileBacktrace *)local_430,this->Makefile);
            pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                      (&pcVar5->CompileOptionsBacktraces,(value_type *)local_430);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_430);
          }
        }
        else {
          bVar2 = std::operator==(prop,"COMPILE_FEATURES");
          if (bVar2) {
            pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&pcVar5->CompileFeaturesEntries);
            pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                      (&pcVar5->CompileFeaturesBacktraces);
            if (value != (char *)0x0) {
              pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_450,value,
                         (allocator *)((long)&lfbt_2.Snapshot.Position.Position + 7));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&pcVar5->CompileFeaturesEntries,&local_450);
              std::__cxx11::string::~string((string *)&local_450);
              std::allocator<char>::~allocator
                        ((allocator<char> *)((long)&lfbt_2.Snapshot.Position.Position + 7));
              cmMakefile::GetBacktrace((cmListFileBacktrace *)local_498,this->Makefile);
              pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                        (&pcVar5->CompileFeaturesBacktraces,(value_type *)local_498);
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_498);
            }
          }
          else {
            bVar2 = std::operator==(prop,"COMPILE_DEFINITIONS");
            if (bVar2) {
              pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::clear(&pcVar5->CompileDefinitionsEntries);
              pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                        (&pcVar5->CompileDefinitionsBacktraces);
              if (value != (char *)0x0) {
                pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_4b8,value,
                           (allocator *)((long)&lfbt_3.Snapshot.Position.Position + 7));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&pcVar5->CompileDefinitionsEntries,&local_4b8);
                std::__cxx11::string::~string((string *)&local_4b8);
                std::allocator<char>::~allocator
                          ((allocator<char> *)((long)&lfbt_3.Snapshot.Position.Position + 7));
                cmMakefile::GetBacktrace((cmListFileBacktrace *)local_500,this->Makefile);
                pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&pcVar5->CompileDefinitionsBacktraces,(value_type *)local_500);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_500);
              }
            }
            else {
              bVar2 = std::operator==(prop,"EXPORT_NAME");
              if ((bVar2) && (bVar2 = IsImported(this), bVar2)) {
                std::__cxx11::ostringstream::ostringstream(local_678);
                poVar4 = std::operator<<((ostream *)local_678,
                                         "EXPORT_NAME property can\'t be set on imported targets (\""
                                        );
                poVar4 = std::operator<<(poVar4,(string *)&this->Name);
                std::operator<<(poVar4,"\")\n");
                pcVar1 = this->Makefile;
                std::__cxx11::ostringstream::str();
                cmMakefile::IssueMessage
                          (pcVar1,FATAL_ERROR,(string *)&lfbt_4.Snapshot.Position.Position,false);
                std::__cxx11::string::~string((string *)&lfbt_4.Snapshot.Position.Position);
                std::__cxx11::ostringstream::~ostringstream(local_678);
              }
              else {
                bVar2 = std::operator==(prop,"LINK_LIBRARIES");
                if (bVar2) {
                  pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::clear(&pcVar5->LinkImplementationPropertyEntries);
                  pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                            (&pcVar5->LinkImplementationPropertyBacktraces);
                  if (value != (char *)0x0) {
                    cmMakefile::GetBacktrace((cmListFileBacktrace *)local_6d8,this->Makefile);
                    pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_6f8,value,&local_6f9);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&pcVar5->LinkImplementationPropertyEntries,&local_6f8);
                    std::__cxx11::string::~string((string *)&local_6f8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
                    pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&pcVar5->LinkImplementationPropertyBacktraces,(value_type *)local_6d8)
                    ;
                    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_6d8);
                  }
                }
                else {
                  bVar2 = std::operator==(prop,"SOURCES");
                  if (bVar2) {
                    bVar2 = IsImported(this);
                    if (bVar2) {
                      std::__cxx11::ostringstream::ostringstream(local_878);
                      poVar4 = std::operator<<((ostream *)local_878,
                                               "SOURCES property can\'t be set on imported targets (\""
                                              );
                      poVar4 = std::operator<<(poVar4,(string *)&this->Name);
                      std::operator<<(poVar4,"\")\n");
                      pcVar1 = this->Makefile;
                      std::__cxx11::ostringstream::str();
                      cmMakefile::IssueMessage
                                (pcVar1,FATAL_ERROR,(string *)&lfbt_5.Snapshot.Position.Position,
                                 false);
                      std::__cxx11::string::~string((string *)&lfbt_5.Snapshot.Position.Position);
                      std::__cxx11::ostringstream::~ostringstream(local_878);
                    }
                    else {
                      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::clear(&pcVar5->SourceEntries);
                      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                                (&pcVar5->SourceBacktraces);
                      if (value != (char *)0x0) {
                        cmMakefile::GetBacktrace((cmListFileBacktrace *)local_8d8,this->Makefile);
                        pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)&local_8f8,value,&local_8f9);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back(&pcVar5->SourceEntries,&local_8f8);
                        std::__cxx11::string::~string((string *)&local_8f8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
                        pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&pcVar5->SourceBacktraces,(value_type *)local_8d8);
                        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_8d8);
                      }
                    }
                  }
                  else {
                    cmPropertyMap::SetProperty(&this->Properties,prop,value);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar4 = std::operator<<((ostream *)local_198,
                             "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \""
                            );
    poVar4 = std::operator<<(poVar4,(string *)prop);
    std::operator<<(poVar4,"\" is not allowed.");
    pcVar1 = this->Makefile;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8,false);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void cmTarget::SetProperty(const std::string& prop, const char* value)
{
  if (this->GetType() == cmState::INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if (prop == "NAME")
    {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if(prop == "INCLUDE_DIRECTORIES")
    {
    this->Internal->IncludeDirectoriesEntries.clear();
    this->Internal->IncludeDirectoriesBacktraces.clear();
    if (value)
      {
      this->Internal->IncludeDirectoriesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "COMPILE_OPTIONS")
    {
    this->Internal->CompileOptionsEntries.clear();
    this->Internal->CompileOptionsBacktraces.clear();
    if (value)
      {
      this->Internal->CompileOptionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "COMPILE_FEATURES")
    {
    this->Internal->CompileFeaturesEntries.clear();
    this->Internal->CompileFeaturesBacktraces.clear();
    if (value)
      {
      this->Internal->CompileFeaturesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "COMPILE_DEFINITIONS")
    {
    this->Internal->CompileDefinitionsEntries.clear();
    this->Internal->CompileDefinitionsBacktraces.clear();
    if (value)
      {
      this->Internal->CompileDefinitionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "EXPORT_NAME" && this->IsImported())
    {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
          << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  else if (prop == "LINK_LIBRARIES")
    {
    this->Internal->LinkImplementationPropertyEntries.clear();
    this->Internal->LinkImplementationPropertyBacktraces.clear();
    if (value)
      {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.push_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
      }
    }
  else if (prop == "SOURCES")
    {
    if(this->IsImported())
      {
      std::ostringstream e;
      e << "SOURCES property can't be set on imported targets (\""
            << this->Name << "\")\n";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }

    this->Internal->SourceEntries.clear();
    this->Internal->SourceBacktraces.clear();
    if (value)
      {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->SourceEntries.push_back(value);
      this->Internal->SourceBacktraces.push_back(lfbt);
      }
    }
  else
    {
    this->Properties.SetProperty(prop, value);
    }
}